

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O2

void __thiscall
cppgenerate::Constructor::printSignature
          (Constructor *this,Class *parent,ostream *stream,bool withAccessModifier)

{
  ostream *poVar1;
  undefined7 in_register_00000009;
  string local_40;
  
  if (((int)CONCAT71(in_register_00000009,withAccessModifier) != 0) &&
     ((ulong)this->m_accessModifier < 3)) {
    poVar1 = std::operator<<(stream,&DAT_00116180 +
                                    *(int *)(&DAT_00116180 + (ulong)this->m_accessModifier * 4));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (1 < (this->m_documentation)._M_string_length) {
    poVar1 = std::operator<<(stream,"/** ");
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1," */");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  Class::getName_abi_cxx11_(&local_40,parent);
  printConstructorSignature(this,stream,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(stream,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Constructor::printSignature( const cppgenerate::Class* parent, std::ostream& stream, bool withAccessModifier ) const {
    if( withAccessModifier ){
        switch( m_accessModifier ){
            case AccessModifier::PUBLIC:
                stream << "public:" << std::endl;
                break;
            case AccessModifier::PRIVATE:
                stream << "private:" << std::endl;
                break;
            case AccessModifier::PROTECTED:
                stream << "protected:" << std::endl;
                break;
        }
    }

    if( m_documentation.length() > 1 ){
        stream << "/** " << m_documentation << " */" << std::endl;
    }

    printConstructorSignature( stream, parent->getName(), false );

    stream << ";" << std::endl;
}